

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack32_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = *in + base;
  out[1] = in[1] + base;
  out[2] = in[2] + base;
  out[3] = in[3] + base;
  out[4] = in[4] + base;
  out[5] = in[5] + base;
  out[6] = in[6] + base;
  out[7] = in[7] + base;
  out[8] = in[8] + base;
  out[9] = in[9] + base;
  out[10] = in[10] + base;
  out[0xb] = in[0xb] + base;
  out[0xc] = in[0xc] + base;
  out[0xd] = in[0xd] + base;
  out[0xe] = in[0xe] + base;
  out[0xf] = in[0xf] + base;
  out[0x10] = in[0x10] + base;
  out[0x11] = in[0x11] + base;
  out[0x12] = in[0x12] + base;
  out[0x13] = in[0x13] + base;
  out[0x14] = in[0x14] + base;
  out[0x15] = in[0x15] + base;
  out[0x16] = in[0x16] + base;
  out[0x17] = in[0x17] + base;
  out[0x18] = in[0x18] + base;
  out[0x19] = in[0x19] + base;
  out[0x1a] = in[0x1a] + base;
  out[0x1b] = in[0x1b] + base;
  out[0x1c] = in[0x1c] + base;
  out[0x1d] = in[0x1d] + base;
  out[0x1e] = in[0x1e] + base;
  out[0x1f] = base + in[0x1f];
  return in + 0x20;
}

Assistant:

uint32_t * unpack32_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}